

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

ssize_t sf_parse_token(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  uint8_t uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8_t *p;
  
  uVar1 = *begin;
  pbVar3 = begin;
  if (((byte)(uVar1 + 0xa5) < 0xe6) && (uVar1 != '*' && 0x19 < (byte)(uVar1 + 0x9f))) {
    return -1;
  }
  while ((pbVar2 = end, pbVar3 != end && (pbVar2 = pbVar3, SF_TOKEN_CHARS[*pbVar3] != 0))) {
    pbVar3 = pbVar3 + 1;
  }
  if (dest == (nghttp2_sf_value *)0x0) {
    return (long)pbVar2 - (long)begin;
  }
  dest->type = '\x04';
  (dest->field_1).s.base = begin;
  (dest->field_1).s.len = (long)pbVar2 - (long)begin;
  return (long)pbVar2 - (long)begin;
}

Assistant:

static ssize_t sf_parse_token(nghttp2_sf_value *dest, const uint8_t *begin,
                              const uint8_t *end) {
  const uint8_t *p = begin;

  if ((*p < 'A' || 'Z' < *p) && (*p < 'a' || 'z' < *p) && *p != '*') {
    return -1;
  }

  for (; p != end && SF_TOKEN_CHARS[*p]; ++p)
    ;

  if (dest) {
    dest->type = NGHTTP2_SF_VALUE_TYPE_TOKEN;
    dest->s.base = begin;
    dest->s.len = (size_t)(p - begin);
  }

  return p - begin;
}